

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2wedge_relations.cc
# Opt level: O0

bool S2::WedgeIntersects(S2Point *a0,S2Point *ab1,S2Point *a2,S2Point *b0,S2Point *b2)

{
  bool bVar1;
  undefined1 local_31;
  S2Point *b2_local;
  S2Point *b0_local;
  S2Point *a2_local;
  S2Point *ab1_local;
  S2Point *a0_local;
  
  bVar1 = s2pred::OrderedCCW(a0,b2,b0,ab1);
  local_31 = false;
  if (bVar1) {
    local_31 = s2pred::OrderedCCW(b0,a2,a0,ab1);
  }
  return (bool)((local_31 ^ 0xffU) & 1);
}

Assistant:

bool WedgeIntersects(
    const S2Point& a0, const S2Point& ab1, const S2Point& a2,
    const S2Point& b0, const S2Point& b2) {
  // For A not to intersect B (where each loop interior is defined to be
  // its left side), the CCW edge order around ab1 must be a0 b2 b0 a2.
  // Note that it's important to write these conditions as negatives
  // (!OrderedCCW(a,b,c,o) rather than Ordered(c,b,a,o)) to get correct
  // results when two vertices are the same.
  return !(s2pred::OrderedCCW(a0, b2, b0, ab1) &&
           s2pred::OrderedCCW(b0, a2, a0, ab1));
}